

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

int P_Thing_CheckProximity
              (AActor *self,PClass *classname,double distance,int count,int flags,int ptr,
              bool counting)

{
  double dVar1;
  uint uVar2;
  AActor *pAVar3;
  bool bVar4;
  uint uVar5;
  AActor *this;
  AActor *other;
  PClass *pPVar6;
  uint uVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  AActor *local_90;
  double local_60;
  double local_58;
  TThinkerIterator<AActor> it;
  
  this = COPY_AAPTR(self,ptr);
  uVar5 = 0;
  if (((0.0 < distance) && (classname != (PClass *)0x0)) && (uVar5 = 0, this != (AActor *)0x0)) {
    TThinkerIterator<AActor>::TThinkerIterator
              ((TThinkerIterator<AActor> *)&it.super_FThinkerIterator,0x80);
    uVar7 = (uint)((flags & 0x22U) == 0);
    local_60 = 0.0;
    local_90 = (AActor *)0x0;
    uVar8 = 0;
    local_58 = distance;
    uVar2 = 0;
LAB_00458dec:
    do {
      other = (AActor *)FThinkerIterator::Next(&it.super_FThinkerIterator,false);
      uVar5 = uVar2;
      if (other == (AActor *)0x0) goto LAB_00458f90;
    } while ((other == this) || (((other->flags).Value & 0x10000000) != 0));
    if ((flags & 1U) == 0) {
      pPVar6 = DObject::GetClass((DObject *)other);
      if (pPVar6 != classname) goto LAB_00458dec;
    }
    else {
      bVar4 = DObject::IsKindOf((DObject *)other,classname);
      if (!bVar4) goto LAB_00458dec;
    }
    dVar9 = AActor::Distance2D(this,other,false);
    if (distance <= dVar9) goto LAB_00458dec;
    if ((flags & 4U) == 0) {
      dVar9 = (this->__Pos).Z;
      dVar1 = (other->__Pos).Z;
      if (((dVar9 <= dVar1) || (distance <= dVar9 - (other->Height + dVar1))) &&
         ((dVar1 < dVar9 || (distance <= dVar1 - (dVar9 + this->Height))))) goto LAB_00458dec;
    }
    if ((((uint)flags >> 0xc & 1) != 0) && (bVar4 = P_CheckSight(other,this,9), !bVar4))
    goto LAB_00458dec;
    pAVar3 = local_90;
    dVar9 = local_60;
    dVar1 = local_58;
    if (((flags & 0x1c0U) != 0) &&
       ((((dVar10 = AActor::Distance2D(this,other,false), pAVar3 = other,
          ((uint)flags >> 10 & 1) == 0 || (dVar1 = dVar10, local_58 <= dVar10)) &&
         ((((uint)flags >> 9 & 1) == 0 || (dVar9 = dVar10, dVar1 = local_58, dVar10 <= local_60))))
        && (pAVar3 = local_90, dVar9 = local_60, dVar1 = local_58, local_90 == (AActor *)0x0)))) {
      pAVar3 = other;
    }
    local_58 = dVar1;
    local_60 = dVar9;
    local_90 = pAVar3;
    if (((other->flags6).Value & 0x40000) == 0) {
      if ((flags & 0x10U) != 0) goto LAB_00458dec;
    }
    else if ((flags & 0x18U) == 0) goto LAB_00458dec;
    uVar5 = uVar2 + 1;
    bVar4 = (int)uVar2 < count;
    uVar2 = uVar5;
    if ((bVar4 || counting) || (uVar8 = uVar7, (flags & 0x600U) != 0 && (flags & 0x1c0U) != 0))
    goto LAB_00458dec;
LAB_00458f90:
    if (local_90 != (AActor *)0x0 && (flags & 0x1c0U) != 0) {
      if (((uint)flags >> 0xb & 1) == 0) {
        if ((flags & 0x40U) != 0) {
          (self->target).field_0.p = local_90;
        }
        if ((char)flags < '\0') {
          (self->master).field_0.p = local_90;
        }
      }
      else {
        if ((flags & 0x40U) != 0) {
          (this->target).field_0.p = local_90;
        }
        self = this;
        if ((char)flags < '\0') {
          (this->master).field_0.p = local_90;
        }
      }
      if (((uint)flags >> 8 & 1) != 0) {
        (self->tracer).field_0.p = local_90;
      }
    }
    if (!counting) {
      if (uVar5 == count) {
        uVar5 = 1;
      }
      else {
        bVar4 = (int)uVar5 < count;
        uVar5 = uVar8;
        if (bVar4) {
          uVar5 = (uint)((flags & 0x22U) == 2);
        }
      }
    }
  }
  return uVar5;
}

Assistant:

int P_Thing_CheckProximity(AActor *self, PClass *classname, double distance, int count, int flags, int ptr, bool counting)
{
	AActor *ref = COPY_AAPTR(self, ptr);

	// We need these to check out.
	if (!ref || !classname || distance <= 0)
		return 0;
	
	int counter = 0;
	int result = 0;
	double closer = distance, farther = 0, current = distance;
	const bool ptrWillChange = !!(flags & (CPXF_SETTARGET | CPXF_SETMASTER | CPXF_SETTRACER));
	const bool ptrDistPref = !!(flags & (CPXF_CLOSEST | CPXF_FARTHEST));

	TThinkerIterator<AActor> it;
	AActor *mo, *dist = nullptr;

	// [MC] Process of elimination, I think, will get through this as quickly and 
	// efficiently as possible. 
	while ((mo = it.Next()))
	{
		if (mo == ref) //Don't count self.
			continue;

		// no unmorphed versions of currently morphed players.
		if (mo->flags & MF_UNMORPHED)
			continue;

		// Check inheritance for the classname. Taken partly from CheckClass DECORATE function.
		if (flags & CPXF_ANCESTOR)
		{
			if (!(mo->IsKindOf(classname)))
				continue;
		}
		// Otherwise, just check for the regular class name.
		else if (classname != mo->GetClass())
			continue;

		// [MC]Make sure it's in range and respect the desire for Z or not. The function forces it to use
		// Z later for ensuring CLOSEST and FARTHEST flags are respected perfectly.
		// Ripped from sphere checking in A_RadiusGive (along with a number of things).
		if ((ref->Distance2D(mo) < distance &&
			((flags & CPXF_NOZ) ||
			((ref->Z() > mo->Z() && ref->Z() - mo->Top() < distance) ||
			(ref->Z() <= mo->Z() && mo->Z() - ref->Top() < distance)))))
		{
			if ((flags & CPXF_CHECKSIGHT) && !(P_CheckSight(mo, ref, SF_IGNOREVISIBILITY | SF_IGNOREWATERBOUNDARY)))
				continue;

			if (ptrWillChange)
			{
				current = ref->Distance2D(mo);

				if ((flags & CPXF_CLOSEST) && (current < closer))
				{
					dist = mo;
					closer = current; // This actor's closer. Set the new standard.
				}
				else if ((flags & CPXF_FARTHEST) && (current > farther))
				{
					dist = mo;
					farther = current;
				}
				else if (!dist)
					dist = mo; // Just get the first one and call it quits if there's nothing selected.
			}
			if (mo->flags6 & MF6_KILLED)
			{
				if (!(flags & (CPXF_COUNTDEAD | CPXF_DEADONLY)))
					continue;
			}
			else
			{
				if (flags & CPXF_DEADONLY)
					continue;
			}
			counter++;

			// Abort if the number of matching classes nearby is greater, we have obviously succeeded in our goal.
			// Don't abort if calling the counting version CheckProximity non-action function.
			if (!counting && counter > count)
			{					
				result = (flags & (CPXF_LESSOREQUAL | CPXF_EXACT)) ? 0 : 1;

				// However, if we have one SET* flag and either the closest or farthest flags, keep the function going.
				if (ptrWillChange && ptrDistPref)
					continue;
				else
					break;
			}
		}
	}

	if (ptrWillChange && dist != 0)
	{
		if (flags & CPXF_SETONPTR)
		{
			if (flags & CPXF_SETTARGET)		ref->target = dist;
			if (flags & CPXF_SETMASTER)		ref->master = dist;
			if (flags & CPXF_SETTRACER)		ref->tracer = dist;
		}
		else
		{
			if (flags & CPXF_SETTARGET)		self->target = dist;
			if (flags & CPXF_SETMASTER)		self->master = dist;
			if (flags & CPXF_SETTRACER)		self->tracer = dist;
		}
	}

	if (!counting)
	{
		if (counter == count)
			result = 1;
		else if (counter < count)
			result = !!((flags & CPXF_LESSOREQUAL) && !(flags & CPXF_EXACT)) ? 1 : 0;
	}
	return counting ? counter : result;
}